

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase152::run(TestCase152 *this)

{
  return;
}

Assistant:

TEST(UnitMeasure, Bounded) {
  // TODO(someday): Some script should attempt to compile this test once with each "COMPILE ERROR"
  //   line restored to verify that they actually error out.

  KJ_EXPECT((boundedValue<456>() + boundedValue<123>()).unwrap() == 456 + 123);
  KJ_EXPECT(boundedValue<456>().subtractChecked(boundedValue<123>(), [](){}).unwrap() == 456 - 123);
  KJ_EXPECT((boundedValue<456>() * boundedValue<123>()).unwrap() == 456 * 123);
  KJ_EXPECT((boundedValue<456>() / boundedValue<123>()).unwrap() == 456 / 123);
  KJ_EXPECT((boundedValue<456>() % boundedValue<123>()).unwrap() == 456 % 123);


  {
    Bounded<123, uint8_t> succ KJ_UNUSED;
    // COMPILE ERROR: Bounded<1234, uint8_t> err KJ_UNUSED;
    // COMPILE ERROR: auto err KJ_UNUSED = boundedValue<0xffffffffull>() + boundedValue<1>();
  }

  {
    Bounded<123, uint8_t> succ1 KJ_UNUSED = boundedValue<123>();
    Bounded<123, uint8_t> succ2 KJ_UNUSED = boundedValue<122>();
    Bounded<123, uint8_t> succ3 KJ_UNUSED = boundedValue<0>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = boundedValue<124>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = boundedValue<125>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = boundedValue<123456>();
  }

  Bounded<123, uint8_t> foo;
  foo = boundedValue<123>();
  foo = boundedValue<122>();
  foo = boundedValue<0>();
  // COMPILE ERROR: foo = boundedValue<124>();
  // COMPILE ERROR: foo = boundedValue<125>();
  // COMPILE ERROR: foo = boundedValue<123456>();

  assertMax<122>(foo, []() {});
  // COMPILE ERROR: assertMax<123>(foo, []() {});
  // COMPILE ERROR: assertMax<124>(foo, []() {});

  assertMaxBits<6>(foo, []() {});
  // COMPILE ERROR: assertMaxBits<7>(foo, []() {});
  // COMPILE ERROR: assertMaxBits<8>(foo, []() {});

  Bounded<12, uint8_t> bar;
  // COMPILE ERROR: bar = foo;
  // COMPILE ERROR: bar = foo.assertMax<13>([]() {});
  bool caught = false;
  foo = boundedValue<13>();
  bar = foo.assertMax<12>([&]() { caught = true; });
  KJ_EXPECT(caught);

  foo = boundedValue<100>() + boundedValue<23>();
  // COMPILE ERROR: foo = boundedValue<100>() + boundedValue<24>();

  bar = boundedValue<3>() * boundedValue<4>();
  // COMPILE ERROR: bar = boundedValue<2>() * boundedValue<7>();

  foo.subtractChecked(boundedValue<122>(), []() { KJ_FAIL_EXPECT(""); });
  foo.subtractChecked(boundedValue<123>(), []() { KJ_FAIL_EXPECT(""); });
  caught = false;
  foo.subtractChecked(boundedValue<124>(), [&]() { caught = true; });
  KJ_EXPECT(caught);

  {
    Bounded<65535, uint16_t> succ1 KJ_UNUSED = bounded((uint16_t)123);
    // COMPILE ERROR: Bounded<65534, uint16_t> err KJ_UNUSED = bounded((uint16_t)123);
  }

  uint old = foo.unwrap();
  foo = foo * unit<decltype(foo)>();
  KJ_EXPECT(foo.unwrap() == old);

  {
    Bounded<1234, uint16_t> x = bounded<123>();
    uint16_t succ = unbound(x);
    KJ_EXPECT(succ == 123);

    // COMPILE ERROR: uint8_t err KJ_UNUSED = unbound(x);
  }
}